

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-circular-array.cc
# Opt level: O1

void __thiscall CircularArrayTest_size_Test::TestBody(CircularArrayTest_size_Test *this)

{
  int line;
  long lVar1;
  char *message;
  AssertionResult gtest_ar;
  CircularArray<(anonymous_namespace)::TestObject,_2UL> ca;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_58;
  undefined1 local_50 [16];
  AssertHelper local_40;
  CircularArray<(anonymous_namespace)::TestObject,_2UL> local_38;
  
  lVar1 = 0;
  do {
    (&local_38.contents_._M_elems[0].moved)[lVar1] = false;
    *(undefined8 *)((long)&local_38.contents_._M_elems[0].data + lVar1) = 0;
    lVar1 = lVar1 + 0xc;
  } while (lVar1 != 0x18);
  (anonymous_namespace)::TestObject::construct_count =
       (anonymous_namespace)::TestObject::construct_count + 2;
  local_38.size_ = 0;
  local_38.front_ = 0;
  local_40.data_._0_4_ = 0;
  local_58._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
            ((internal *)local_50,"0U","ca.size()",(uint *)&local_40,(unsigned_long *)&local_58);
  if (local_50[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_58);
    if ((undefined8 *)CONCAT71(local_50._9_7_,local_50[8]) == (undefined8 *)0x0) {
      message = "";
    }
    else {
      message = *(char **)CONCAT71(local_50._9_7_,local_50[8]);
    }
    line = 0xda;
  }
  else {
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
        CONCAT71(local_50._9_7_,local_50[8]) !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)(local_50 + 8),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT71(local_50._9_7_,local_50[8]));
    }
    local_50._0_4_ = 1;
    local_50._4_4_ = 0;
    local_50[8] = false;
    (anonymous_namespace)::TestObject::construct_count =
         (anonymous_namespace)::TestObject::construct_count + 1;
    wabt::CircularArray<(anonymous_namespace)::TestObject,_2UL>::push_back
              (&local_38,(value_type *)local_50);
    (anonymous_namespace)::TestObject::destruct_count =
         (anonymous_namespace)::TestObject::destruct_count + 1;
    local_40.data_._0_4_ = 1;
    local_58._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38.size_;
    testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
              ((internal *)local_50,"1U","ca.size()",(uint *)&local_40,(unsigned_long *)&local_58);
    if (local_50[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_58);
      if ((undefined8 *)CONCAT71(local_50._9_7_,local_50[8]) == (undefined8 *)0x0) {
        message = "";
      }
      else {
        message = *(char **)CONCAT71(local_50._9_7_,local_50[8]);
      }
      line = 0xdd;
    }
    else {
      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
          CONCAT71(local_50._9_7_,local_50[8]) !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)(local_50 + 8),
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT71(local_50._9_7_,local_50[8]));
      }
      local_50._0_4_ = 2;
      local_50._4_4_ = 0;
      local_50[8] = false;
      (anonymous_namespace)::TestObject::construct_count =
           (anonymous_namespace)::TestObject::construct_count + 1;
      wabt::CircularArray<(anonymous_namespace)::TestObject,_2UL>::push_back
                (&local_38,(value_type *)local_50);
      (anonymous_namespace)::TestObject::destruct_count =
           (anonymous_namespace)::TestObject::destruct_count + 1;
      local_40.data_._0_4_ = 2;
      local_58._M_head_impl =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38.size_
      ;
      testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
                ((internal *)local_50,"2U","ca.size()",(uint *)&local_40,(unsigned_long *)&local_58)
      ;
      if (local_50[0] == (internal)0x0) {
        testing::Message::Message((Message *)&local_58);
        if ((undefined8 *)CONCAT71(local_50._9_7_,local_50[8]) == (undefined8 *)0x0) {
          message = "";
        }
        else {
          message = *(char **)CONCAT71(local_50._9_7_,local_50[8]);
        }
        line = 0xe0;
      }
      else {
        if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            CONCAT71(local_50._9_7_,local_50[8]) !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)(local_50 + 8),
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT71(local_50._9_7_,local_50[8]));
        }
        wabt::CircularArray<(anonymous_namespace)::TestObject,_2UL>::pop_back(&local_38);
        local_40.data_._0_4_ = 1;
        local_58._M_head_impl =
             (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
             local_38.size_;
        testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
                  ((internal *)local_50,"1U","ca.size()",(uint *)&local_40,
                   (unsigned_long *)&local_58);
        if (local_50[0] == (internal)0x0) {
          testing::Message::Message((Message *)&local_58);
          if ((undefined8 *)CONCAT71(local_50._9_7_,local_50[8]) == (undefined8 *)0x0) {
            message = "";
          }
          else {
            message = *(char **)CONCAT71(local_50._9_7_,local_50[8]);
          }
          line = 0xe3;
        }
        else {
          if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              CONCAT71(local_50._9_7_,local_50[8]) !=
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            std::
            default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)(local_50 + 8),
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         CONCAT71(local_50._9_7_,local_50[8]));
          }
          wabt::CircularArray<(anonymous_namespace)::TestObject,_2UL>::pop_back(&local_38);
          local_40.data_._0_4_ = 0;
          local_58._M_head_impl =
               (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
               local_38.size_;
          testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
                    ((internal *)local_50,"0U","ca.size()",(uint *)&local_40,
                     (unsigned_long *)&local_58);
          if (local_50[0] != (internal)0x0) goto LAB_0014331e;
          testing::Message::Message((Message *)&local_58);
          if ((undefined8 *)CONCAT71(local_50._9_7_,local_50[8]) == (undefined8 *)0x0) {
            message = "";
          }
          else {
            message = *(char **)CONCAT71(local_50._9_7_,local_50[8]);
          }
          line = 0xe6;
        }
      }
    }
  }
  testing::internal::AssertHelper::AssertHelper
            (&local_40,kFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/src/test-circular-array.cc"
             ,line,message);
  testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_58);
  testing::internal::AssertHelper::~AssertHelper(&local_40);
  if (local_58._M_head_impl !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    (**(code **)(*(long *)local_58._M_head_impl + 8))();
  }
LAB_0014331e:
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
      CONCAT71(local_50._9_7_,local_50[8]) !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(local_50 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT71(local_50._9_7_,local_50[8]));
  }
  wabt::CircularArray<(anonymous_namespace)::TestObject,_2UL>::~CircularArray(&local_38);
  return;
}

Assistant:

TEST_F(CircularArrayTest, size) {
  CircularArray<TestObject, 2> ca;

  ASSERT_EQ(0U, ca.size());

  ca.push_back(TestObject(1));
  ASSERT_EQ(1U, ca.size());

  ca.push_back(TestObject(2));
  ASSERT_EQ(2U, ca.size());

  ca.pop_back();
  ASSERT_EQ(1U, ca.size());

  ca.pop_back();
  ASSERT_EQ(0U, ca.size());
}